

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BroadcastToDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_broadcasttodynamic(NeuralNetworkLayer *this)

{
  bool bVar1;
  BroadcastToDynamicLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_broadcasttodynamic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_broadcasttodynamic(this);
    this_00 = (BroadcastToDynamicLayerParams *)operator_new(0x18);
    BroadcastToDynamicLayerParams::BroadcastToDynamicLayerParams(this_00);
    (this->layer_).broadcasttodynamic_ = this_00;
  }
  return (BroadcastToDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BroadcastToDynamicLayerParams* NeuralNetworkLayer::mutable_broadcasttodynamic() {
  if (!has_broadcasttodynamic()) {
    clear_layer();
    set_has_broadcasttodynamic();
    layer_.broadcasttodynamic_ = new ::CoreML::Specification::BroadcastToDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.broadcastToDynamic)
  return layer_.broadcasttodynamic_;
}